

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_op_add_cc(TCGContext_conflict8 *tcg_ctx,TCGv_i32 dst,TCGv_i32 src1,TCGv_i32 src2)

{
  TCGv_i32 src2_local;
  TCGv_i32 src1_local;
  TCGv_i32 dst_local;
  TCGContext_conflict8 *tcg_ctx_local;
  
  tcg_gen_mov_i64_sparc64(tcg_ctx,(TCGv_i32)tcg_ctx->cpu_cc_src,src1);
  tcg_gen_mov_i64_sparc64(tcg_ctx,(TCGv_i32)tcg_ctx->cpu_cc_src2,src2);
  tcg_gen_add_i64(tcg_ctx,(TCGv_i32)tcg_ctx->cpu_cc_dst,(TCGv_i32)tcg_ctx->cpu_cc_src,
                  (TCGv_i32)tcg_ctx->cpu_cc_src2);
  tcg_gen_mov_i64_sparc64(tcg_ctx,dst,(TCGv_i32)tcg_ctx->cpu_cc_dst);
  return;
}

Assistant:

static inline void gen_op_add_cc(TCGContext *tcg_ctx, TCGv dst, TCGv src1, TCGv src2)
{
    tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_cc_src, src1);
    tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_cc_src2, src2);
    tcg_gen_add_tl(tcg_ctx, tcg_ctx->cpu_cc_dst, tcg_ctx->cpu_cc_src, tcg_ctx->cpu_cc_src2);
    tcg_gen_mov_tl(tcg_ctx, dst, tcg_ctx->cpu_cc_dst);
}